

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::executeBFS(Executor *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  SharedPtr<Node> *pSVar4;
  element_type *peVar5;
  Values *pVVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  uint *puVar10;
  shared_ptr<Node> local_b0;
  shared_ptr<Node> local_a0;
  undefined1 local_90 [8];
  shared_ptr<Node> node;
  uint rank;
  Values local;
  uint local_58;
  uint change;
  uint capacity;
  uint kValue;
  uint k;
  uint jValue;
  uint j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  undefined1 local_20 [8];
  SharedPtr<Node> current;
  Executor *this_local;
  
  current.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  do {
    bVar2 = OpenList::isEmpty(&this->m_openList);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::operator<<((ostream *)&std::cout,"No solution found.\n> ");
      return;
    }
    pSVar4 = OpenList::getFirst(&this->m_openList);
    std::shared_ptr<Node>::shared_ptr((shared_ptr<Node> *)local_20,pSVar4);
    OpenList::removeFirst(&this->m_openList);
    peVar5 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_20);
    pVVar6 = Node::getValues(peVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,pVVar6);
    ClosedList::addLast(&this->m_closedList,&local_38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
    for (k = 0; uVar7 = (ulong)k,
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_sizes),
        uVar7 < sVar8; k = k + 1) {
      peVar5 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_20);
      kValue = Node::getValueAt(peVar5,k);
      if (kValue != 0) {
        for (capacity = 0; uVar7 = (ulong)capacity,
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_sizes),
            uVar7 < sVar8; capacity = capacity + 1) {
          if (capacity != k) {
            peVar5 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_20);
            uVar3 = Node::getValueAt(peVar5,capacity);
            change = uVar3;
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&this->m_sizes,(ulong)capacity);
            if (uVar3 != *pvVar9) {
              pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (&this->m_sizes,(ulong)capacity);
              local_58 = *pvVar9 - change;
              puVar10 = std::min<unsigned_int>(&local_58,&kValue);
              local.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = *puVar10;
              peVar5 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_20);
              pVVar6 = Node::getValues(peVar5);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rank,pVVar6);
              uVar3 = local.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
              pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rank,
                                  (ulong)k);
              uVar1 = local.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
              *pvVar9 = *pvVar9 - uVar3;
              pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rank,
                                  (ulong)capacity);
              *pvVar9 = uVar1 + *pvVar9;
              bVar2 = ClosedList::contains(&this->m_closedList,(Values *)&rank);
              if (bVar2) {
                node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
                     9;
              }
              else {
                node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
                     calculateRank(this,(Values *)&rank);
                std::
                make_shared<Node,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::shared_ptr<Node>const&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                           (shared_ptr<Node> *)&rank,(uint *)local_20,&k,&capacity);
                bVar2 = (uint)node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi != 0;
                if (bVar2) {
                  std::shared_ptr<Node>::shared_ptr(&local_b0,(shared_ptr<Node> *)local_90);
                  OpenList::addInPlace(&this->m_openList,&local_b0);
                  std::shared_ptr<Node>::~shared_ptr(&local_b0);
                }
                else {
                  std::shared_ptr<Node>::shared_ptr(&local_a0,(shared_ptr<Node> *)local_90);
                  showSolution(this,&local_a0);
                  std::shared_ptr<Node>::~shared_ptr(&local_a0);
                }
                node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_3_ =
                     0;
                node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ =
                     !bVar2;
                std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_90);
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rank);
              if ((node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
                   != 0) &&
                 (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
                  != 9)) goto LAB_0010d08e;
            }
          }
        }
      }
    }
    node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
LAB_0010d08e:
    std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_20);
    if (node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ != 0) {
      return;
    }
  } while( true );
}

Assistant:

void Executor::executeBFS()
{
    while (!m_openList.isEmpty())
    {
        const auto current = m_openList.getFirst();

        m_openList.removeFirst();
        m_closedList.addLast(current->getValues());

        for (unsigned int j = 0; j < m_sizes.size(); j++)
        {
            const auto jValue = current->getValueAt(j);

            // I have nothing to move because unit is empty.
            if (jValue == 0)
                continue;

            for (unsigned int k = 0; k < m_sizes.size(); k++)
            {
                if (k == j)
                    continue;

                const auto kValue = current->getValueAt(k);

                // I cannot move anything here because target unit is full.
                if (kValue == m_sizes[k])
                    continue;

                // How much can I move to this unit.
                const auto capacity = m_sizes[k] - kValue;

                // How much is actually moved this iteration.
                const auto change = std::min(capacity, jValue);

                // Perform movement.
                auto local = current->getValues();
                local[j] -= change;
                local[k] += change;

                // Closed list check.
                if (m_closedList.contains(local))
                    continue;

                const auto rank = calculateRank(local);

                const auto node = std::make_shared<Node>(std::move(local), current, j, k, rank);

                if (rank == 0)
                {
                    showSolution(std::move(node));
                    return;
                }

                m_openList.addInPlace(std::move(node));
            }
        }
    }
    std::cout << "No solution found.\n> ";
}